

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O2

string * bitstring<(unsigned_char)3,(unsigned_char)3>
                   (string *__return_storage_ptr__,
                   flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *ff)

{
  long lVar1;
  int __ix;
  long *plVar2;
  stringstream buffer;
  stringstream asStack_1a8 [16];
  long local_198 [47];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  lVar1 = *(long *)(local_198[0] + -0x18);
  __ix = get_manipulator_id();
  plVar2 = std::ios_base::iword((ios_base *)((ostream *)local_198 + lVar1),__ix);
  *plVar2 = 1;
  operator<<((ostream *)local_198,ff);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string bitstring(const flexfloat<e, f> &ff) noexcept
{
    std::stringstream buffer;
    buffer << flexfloat_as_bits << ff;
    return buffer.str();
}